

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::AnimationCurve::AnimationCurve
          (AnimationCurve *this,uint64_t id,Element *element,string *name,Document *param_4)

{
  bool bVar1;
  Scope *pSVar2;
  Element *pEVar3;
  size_type sVar4;
  size_type sVar5;
  KeyTimeList *this_00;
  allocator<char> local_181;
  string local_180;
  Element *local_160;
  Element *KeyAttrFlags;
  string local_150;
  Element *local_130;
  Element *KeyAttrDataFloat;
  string local_120;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_f8;
  long *local_f0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_e8;
  long *local_e0;
  long *local_d8;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  Element *local_80;
  Element *KeyValueFloat;
  string local_70;
  Element *local_50;
  Element *KeyTime;
  Scope *local_38;
  Scope *sc;
  Document *param_4_local;
  string *name_local;
  Element *element_local;
  uint64_t id_local;
  AnimationCurve *this_local;
  
  sc = (Scope *)param_4;
  param_4_local = (Document *)name;
  name_local = (string *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  FBX::Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurve_00faf2c0;
  std::vector<long,_std::allocator<long>_>::vector(&this->keys);
  std::vector<float,_std::allocator<float>_>::vector(&this->values);
  std::vector<float,_std::allocator<float>_>::vector(&this->attributes);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->flags);
  pSVar2 = GetRequiredScope((Element *)name_local);
  local_38 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"KeyTime",(allocator<char> *)((long)&KeyValueFloat + 7));
  pEVar3 = GetRequiredElement(pSVar2,&local_70,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&KeyValueFloat + 7));
  pSVar2 = local_38;
  local_50 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"KeyValueFloat",&local_a1);
  pEVar3 = GetRequiredElement(pSVar2,&local_a0,(Element *)0x0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_80 = pEVar3;
  ParseVectorDataArray(&this->keys,local_50);
  ParseVectorDataArray(&this->values,local_80);
  sVar4 = std::vector<long,_std::allocator<long>_>::size(&this->keys);
  sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->values);
  if (sVar4 != sVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,
               "the number of key times does not match the number of keyframe values",&local_c9);
    Util::DOMError(&local_c8,local_50);
  }
  this_00 = &this->keys;
  local_d8 = (long *)std::vector<long,_std::allocator<long>_>::begin(this_00);
  local_e8._M_current = (long *)std::vector<long,_std::allocator<long>_>::end(this_00);
  local_e0 = (long *)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                     ::operator-(&local_e8,1);
  local_f8._M_current = (long *)std::vector<long,_std::allocator<long>_>::begin(this_00);
  local_f0 = (long *)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                     ::operator+(&local_f8,1);
  bVar1 = std::
          equal<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::less<long>>
                    (local_d8,local_e0,local_f0);
  pSVar2 = local_38;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"KeyAttrDataFloat",(allocator<char> *)((long)&KeyAttrFlags + 7))
    ;
    pEVar3 = Scope::operator[](pSVar2,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)((long)&KeyAttrFlags + 7));
    local_130 = pEVar3;
    if (pEVar3 != (Element *)0x0) {
      ParseVectorDataArray(&this->attributes,pEVar3);
    }
    pSVar2 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"KeyAttrFlags",&local_181);
    pEVar3 = Scope::operator[](pSVar2,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    if (pEVar3 != (Element *)0x0) {
      local_160 = pEVar3;
      ParseVectorDataArray(&this->flags,pEVar3);
    }
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"the keyframes are not in ascending order",
             (allocator<char> *)((long)&KeyAttrDataFloat + 7));
  Util::DOMError(&local_120,local_50);
}

Assistant:

AnimationCurve::AnimationCurve(uint64_t id, const Element& element, const std::string& name, const Document& /*doc*/)
: Object(id, element, name)
{
    const Scope& sc = GetRequiredScope(element);
    const Element& KeyTime = GetRequiredElement(sc,"KeyTime");
    const Element& KeyValueFloat = GetRequiredElement(sc,"KeyValueFloat");

    ParseVectorDataArray(keys, KeyTime);
    ParseVectorDataArray(values, KeyValueFloat);

    if(keys.size() != values.size()) {
        DOMError("the number of key times does not match the number of keyframe values",&KeyTime);
    }

    // check if the key times are well-ordered
    if(!std::equal(keys.begin(), keys.end() - 1, keys.begin() + 1, std::less<KeyTimeList::value_type>())) {
        DOMError("the keyframes are not in ascending order",&KeyTime);
    }

    const Element* KeyAttrDataFloat = sc["KeyAttrDataFloat"];
    if(KeyAttrDataFloat) {
        ParseVectorDataArray(attributes, *KeyAttrDataFloat);
    }

    const Element* KeyAttrFlags = sc["KeyAttrFlags"];
    if(KeyAttrFlags) {
        ParseVectorDataArray(flags, *KeyAttrFlags);
    }
}